

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O1

int __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::open
          (reactive_socket_service<asio::ip::udp> *this,char *__file,int __oflag,...)

{
  error_code *in_RCX;
  error_code eVar1;
  
  eVar1 = reactive_socket_service_base::do_open
                    ((reactive_socket_service_base *)&this->super_reactive_socket_service_base,
                     (base_implementation_type *)__file,*___oflag,2,0x11,in_RCX);
  if (eVar1._M_value == 0) {
    *(int *)(__file + 0x10) = *___oflag;
  }
  return in_RCX->_M_value;
}

Assistant:

asio::error_code open(implementation_type& impl,
      const protocol_type& protocol, asio::error_code& ec)
  {
    if (!do_open(impl, protocol.family(),
          protocol.type(), protocol.protocol(), ec))
      impl.protocol_ = protocol;

    ASIO_ERROR_LOCATION(ec);
    return ec;
  }